

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* spirv_cross::CompilerMSL::get_reserved_keyword_set_abi_cxx11_(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_19f0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_117d;
  key_equal local_117c;
  hasher local_117b;
  undefined1 local_117a;
  allocator local_1179;
  allocator local_1178;
  allocator local_1177;
  allocator local_1176;
  allocator local_1175;
  allocator local_1174;
  allocator local_1173;
  allocator local_1172;
  allocator local_1171;
  allocator local_1170;
  allocator local_116f;
  allocator local_116e;
  allocator local_116d;
  allocator local_116c;
  allocator local_116b;
  allocator local_116a;
  allocator local_1169;
  allocator local_1168;
  allocator local_1167;
  allocator local_1166;
  allocator local_1165;
  allocator local_1164;
  allocator local_1163;
  allocator local_1162;
  allocator local_1161;
  allocator local_1160;
  allocator local_115f;
  allocator local_115e;
  allocator local_115d;
  allocator local_115c;
  allocator local_115b;
  allocator local_115a;
  allocator local_1159;
  allocator local_1158;
  allocator local_1157;
  allocator local_1156;
  allocator local_1155;
  allocator local_1154;
  allocator local_1153;
  allocator local_1152;
  allocator local_1151;
  allocator local_1150;
  allocator local_114f;
  allocator local_114e;
  allocator local_114d;
  allocator local_114c;
  allocator local_114b;
  allocator local_114a;
  allocator local_1149;
  allocator local_1148;
  allocator local_1147;
  allocator local_1146;
  allocator local_1145;
  allocator local_1144;
  allocator local_1143;
  allocator local_1142;
  allocator local_1141;
  allocator local_1140;
  allocator local_113f;
  allocator local_113e;
  allocator local_113d;
  allocator local_113c;
  allocator local_113b;
  allocator local_113a;
  allocator local_1139;
  allocator local_1138;
  allocator local_1137;
  allocator local_1136;
  allocator local_1135;
  allocator local_1134;
  allocator local_1133;
  allocator local_1132;
  allocator local_1131;
  allocator local_1130;
  allocator local_112f;
  allocator local_112e;
  allocator local_112d;
  allocator local_112c;
  allocator local_112b;
  allocator local_112a;
  allocator local_1129;
  allocator local_1128;
  allocator local_1127;
  allocator local_1126;
  allocator local_1125;
  allocator local_1124;
  allocator local_1123;
  allocator local_1122;
  allocator local_1121;
  allocator local_1120;
  allocator local_111f;
  allocator local_111e;
  allocator local_111d;
  allocator local_111c;
  allocator local_111b;
  allocator local_111a;
  allocator local_1119;
  allocator local_1118;
  allocator local_1117;
  allocator local_1116;
  allocator local_1115;
  allocator local_1114;
  allocator local_1113;
  allocator local_1112;
  allocator local_1111;
  allocator local_1110;
  allocator local_110f;
  allocator local_110e;
  allocator local_110d;
  allocator local_110c;
  allocator local_110b;
  allocator local_110a;
  allocator local_1109;
  allocator local_1108;
  allocator local_1107;
  allocator local_1106;
  allocator local_1105;
  allocator local_1104;
  allocator local_1103;
  allocator local_1102;
  allocator local_1101;
  allocator local_1100;
  allocator local_10ff;
  allocator local_10fe;
  allocator local_10fd;
  allocator local_10fc;
  allocator local_10fb;
  allocator local_10fa;
  allocator local_10f9;
  allocator local_10f8;
  allocator local_10f7;
  allocator local_10f6;
  allocator local_10f5 [20];
  allocator local_10e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10d8;
  string local_10b8 [32];
  string local_1098 [32];
  string local_1078 [32];
  string local_1058 [32];
  string local_1038 [32];
  string local_1018 [32];
  string local_ff8 [32];
  string local_fd8 [32];
  string local_fb8 [32];
  string local_f98 [32];
  string local_f78 [32];
  string local_f58 [32];
  string local_f38 [32];
  string local_f18 [32];
  string local_ef8 [32];
  string local_ed8 [32];
  string local_eb8 [32];
  string local_e98 [32];
  string local_e78 [32];
  string local_e58 [32];
  string local_e38 [32];
  string local_e18 [32];
  string local_df8 [32];
  string local_dd8 [32];
  string local_db8 [32];
  string local_d98 [32];
  string local_d78 [32];
  string local_d58 [32];
  string local_d38 [32];
  string local_d18 [32];
  string local_cf8 [32];
  string local_cd8 [32];
  string local_cb8 [32];
  string local_c98 [32];
  string local_c78 [32];
  string local_c58 [32];
  string local_c38 [32];
  string local_c18 [32];
  string local_bf8 [32];
  string local_bd8 [32];
  string local_bb8 [32];
  string local_b98 [32];
  string local_b78 [32];
  string local_b58 [32];
  string local_b38 [32];
  string local_b18 [32];
  string local_af8 [32];
  string local_ad8 [32];
  string local_ab8 [32];
  string local_a98 [32];
  string local_a78 [32];
  string local_a58 [32];
  string local_a38 [32];
  string local_a18 [32];
  string local_9f8 [32];
  string local_9d8 [32];
  string local_9b8 [32];
  string local_998 [32];
  string local_978 [32];
  string local_958 [32];
  string local_938 [32];
  string local_918 [32];
  string local_8f8 [32];
  string local_8d8 [32];
  string local_8b8 [32];
  string local_898 [32];
  string local_878 [32];
  string local_858 [32];
  string local_838 [32];
  string local_818 [32];
  string local_7f8 [32];
  string local_7d8 [32];
  string local_7b8 [32];
  string local_798 [32];
  string local_778 [32];
  string local_758 [32];
  string local_738 [32];
  string local_718 [32];
  string local_6f8 [32];
  string local_6d8 [32];
  string local_6b8 [32];
  string local_698 [32];
  string local_678 [32];
  string local_658 [32];
  string local_638 [32];
  string local_618 [32];
  string local_5f8 [32];
  string local_5d8 [32];
  string local_5b8 [32];
  string local_598 [32];
  string local_578 [32];
  string local_558 [32];
  string local_538 [32];
  string local_518 [32];
  string local_4f8 [32];
  string local_4d8 [32];
  string local_4b8 [32];
  string local_498 [32];
  string local_478 [32];
  string local_458 [32];
  string local_438 [32];
  string local_418 [32];
  string local_3f8 [32];
  string local_3d8 [32];
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  iterator local_18;
  size_type local_10;
  
  if (get_reserved_keyword_set[abi:cxx11]()::keywords_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&get_reserved_keyword_set[abi:cxx11]()::keywords_abi_cxx11_);
    if (iVar1 != 0) {
      local_117a = 1;
      local_10e0 = &local_10d8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_10d8,"kernel",&local_10e1);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10b8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_10b8,"vertex",local_10f5);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1098;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1098,"fragment",&local_10f6);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1078;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1078,"compute",&local_10f7);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1058;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1058,"constant",&local_10f8);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1038;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1038,"device",&local_10f9);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1018;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1018,"bias",&local_10fa);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ff8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_ff8,"level",&local_10fb);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_fd8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_fd8,"gradient2d",&local_10fc);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_fb8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_fb8,"gradientcube",&local_10fd);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f98;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f98,"gradient3d",&local_10fe);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f78;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f78,"min_lod_clamp",&local_10ff);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f58;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f58,"assert",&local_1100);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f38;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f38,"VARIABLE_TRACEPOINT",&local_1101);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f18;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f18,"STATIC_DATA_TRACEPOINT",&local_1102);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ef8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_ef8,"STATIC_DATA_TRACEPOINT_V",&local_1103);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ed8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_ed8,"METAL_ALIGN",&local_1104);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_eb8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_eb8,"METAL_ASM",&local_1105);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e98;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e98,"METAL_CONST",&local_1106);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e78;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e78,"METAL_DEPRECATED",&local_1107);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e58;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e58,"METAL_ENABLE_IF",&local_1108);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e38;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e38,"METAL_FUNC",&local_1109);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e18;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e18,"METAL_INTERNAL",&local_110a);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_df8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_df8,"METAL_NON_NULL_RETURN",&local_110b);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dd8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_dd8,"METAL_NORETURN",&local_110c);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_db8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_db8,"METAL_NOTHROW",&local_110d);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d98;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d98,"METAL_PURE",&local_110e);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d78;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d78,"METAL_UNAVAILABLE",&local_110f);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d58;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d58,"METAL_IMPLICIT",&local_1110);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d38;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d38,"METAL_EXPLICIT",&local_1111);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d18;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d18,"METAL_CONST_ARG",&local_1112);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_cf8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_cf8,"METAL_ARG_UNIFORM",&local_1113);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_cd8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_cd8,"METAL_ZERO_ARG",&local_1114);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_cb8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_cb8,"METAL_VALID_LOD_ARG",&local_1115);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c98;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c98,"METAL_VALID_LEVEL_ARG",&local_1116);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c78;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c78,"METAL_VALID_STORE_ORDER",&local_1117);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c58;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c58,"METAL_VALID_LOAD_ORDER",&local_1118);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c38;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_c38,"METAL_VALID_COMPARE_EXCHANGE_FAILURE_ORDER",&local_1119);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c18;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_c18,"METAL_COMPATIBLE_COMPARE_EXCHANGE_ORDERS",&local_111a);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bf8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_bf8,"METAL_VALID_RENDER_TARGET",&local_111b);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bd8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_bd8,"is_function_constant_defined",&local_111c);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bb8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_bb8,"CHAR_BIT",&local_111d);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b98;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b98,"SCHAR_MAX",&local_111e);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b78;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b78,"SCHAR_MIN",&local_111f);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b58;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b58,"UCHAR_MAX",&local_1120);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b38;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b38,"CHAR_MAX",&local_1121);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b18;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b18,"CHAR_MIN",&local_1122);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_af8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_af8,"USHRT_MAX",&local_1123);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ad8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_ad8,"SHRT_MAX",&local_1124);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ab8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_ab8,"SHRT_MIN",&local_1125);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a98;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a98,"UINT_MAX",&local_1126);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a78;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a78,"INT_MAX",&local_1127);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a58;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a58,"INT_MIN",&local_1128);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a38;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a38,"FLT_DIG",&local_1129);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a18;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a18,"FLT_MANT_DIG",&local_112a);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9f8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_9f8,"FLT_MAX_10_EXP",&local_112b);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9d8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_9d8,"FLT_MAX_EXP",&local_112c);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9b8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_9b8,"FLT_MIN_10_EXP",&local_112d);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_998;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_998,"FLT_MIN_EXP",&local_112e);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_978;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_978,"FLT_RADIX",&local_112f);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_958;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_958,"FLT_MAX",&local_1130);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_938;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_938,"FLT_MIN",&local_1131);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_918;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_918,"FLT_EPSILON",&local_1132);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8f8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_8f8,"FP_ILOGB0",&local_1133);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8d8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_8d8,"FP_ILOGBNAN",&local_1134);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8b8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_8b8,"MAXFLOAT",&local_1135);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_898;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_898,"HUGE_VALF",&local_1136);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_878;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_878,"INFINITY",&local_1137);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_858;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_858,"NAN",&local_1138);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_838;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_838,"M_E_F",&local_1139);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_818;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_818,"M_LOG2E_F",&local_113a);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7f8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_7f8,"M_LOG10E_F",&local_113b);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7d8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_7d8,"M_LN2_F",&local_113c);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7b8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_7b8,"M_LN10_F",&local_113d);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_798;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_798,"M_PI_F",&local_113e);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_778,"M_PI_2_F",&local_113f);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_758;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_758,"M_PI_4_F",&local_1140);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_738;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_738,"M_1_PI_F",&local_1141);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_718;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_718,"M_2_PI_F",&local_1142);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6f8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_6f8,"M_2_SQRTPI_F",&local_1143);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6d8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_6d8,"M_SQRT2_F",&local_1144);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6b8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_6b8,"M_SQRT1_2_F",&local_1145);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_698;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_698,"HALF_DIG",&local_1146);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_678;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_678,"HALF_MANT_DIG",&local_1147);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_658;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_658,"HALF_MAX_10_EXP",&local_1148);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_638;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_638,"HALF_MAX_EXP",&local_1149);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_618;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_618,"HALF_MIN_10_EXP",&local_114a);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_5f8,"HALF_MIN_EXP",&local_114b);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5d8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_5d8,"HALF_RADIX",&local_114c);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_5b8,"HALF_MAX",&local_114d);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_598;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_598,"HALF_MIN",&local_114e);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_578;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_578,"HALF_EPSILON",&local_114f);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_558,"MAXHALF",&local_1150);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_538;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_538,"HUGE_VALH",&local_1151);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_518;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_518,"M_E_H",&local_1152);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_4f8,"M_LOG2E_H",&local_1153);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4d8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_4d8,"M_LOG10E_H",&local_1154);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_4b8,"M_LN2_H",&local_1155);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_498;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_498,"M_LN10_H",&local_1156);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_478;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_478,"M_PI_H",&local_1157);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_458,"M_PI_2_H",&local_1158);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_438,"M_PI_4_H",&local_1159);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_418;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_418,"M_1_PI_H",&local_115a);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_3f8,"M_2_PI_H",&local_115b);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_3d8,"M_2_SQRTPI_H",&local_115c);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_3b8,"M_SQRT2_H",&local_115d);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_398,"M_SQRT1_2_H",&local_115e);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_378,"DBL_DIG",&local_115f);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_358,"DBL_MANT_DIG",&local_1160);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_338,"DBL_MAX_10_EXP",&local_1161);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_318,"DBL_MAX_EXP",&local_1162);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2f8,"DBL_MIN_10_EXP",&local_1163);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2d8,"DBL_MIN_EXP",&local_1164);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2b8,"DBL_RADIX",&local_1165);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_298,"DBL_MAX",&local_1166);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_278,"DBL_MIN",&local_1167);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_258,"DBL_EPSILON",&local_1168);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_238,"HUGE_VAL",&local_1169);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_218,"M_E",&local_116a);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1f8,"M_LOG2E",&local_116b);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1d8,"M_LOG10E",&local_116c);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1b8,"M_LN2",&local_116d);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_198,"M_LN10",&local_116e);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_178,"M_PI",&local_116f);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_158,"M_PI_2",&local_1170);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_138,"M_PI_4",&local_1171);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_118,"M_1_PI",&local_1172);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f8,"M_2_PI",&local_1173);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d8,"M_2_SQRTPI",&local_1174);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b8,"M_SQRT2",&local_1175);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_98,"M_SQRT1_2",&local_1176);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_78,"quad_broadcast",&local_1177);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_58,"thread",&local_1178);
      local_10e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_38,"threadgroup",&local_1179);
      local_117a = 0;
      local_18 = &local_10d8;
      local_10 = 0x86;
      ::std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_117d);
      __l._M_len = local_10;
      __l._M_array = local_18;
      ::std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::unordered_set(&get_reserved_keyword_set[abi:cxx11]()::keywords_abi_cxx11_,__l,0,&local_117b,
                      &local_117c,&local_117d);
      ::std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_117d);
      local_19f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_18;
      do {
        local_19f0 = local_19f0 + -1;
        ::std::__cxx11::string::~string((string *)local_19f0);
      } while (local_19f0 != &local_10d8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1179);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1178);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1177);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1176);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1175);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1174);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1173);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1172);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1171);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1170);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_116f);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_116e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_116d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_116c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_116b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_116a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1169);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1168);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1167);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1166);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1165);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1164);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1163);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1162);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1161);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1160);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_115f);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_115e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_115d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_115c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_115b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_115a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1159);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1158);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1157);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1156);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1155);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1154);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1153);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1152);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1151);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1150);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_114f);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_114e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_114d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_114c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_114b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_114a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1149);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1148);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1147);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1146);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1145);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1144);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1143);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1142);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1141);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1140);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_113f);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_113e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_113d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_113c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_113b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_113a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1139);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1138);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1137);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1136);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1135);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1134);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1133);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1132);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1131);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1130);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_112f);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_112e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_112d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_112c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_112b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_112a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1129);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1128);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1127);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1126);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1125);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1124);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1123);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1122);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1121);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1120);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_111f);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_111e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_111d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_111c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_111b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_111a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1119);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1118);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1117);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1116);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1115);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1114);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1113);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1112);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1111);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1110);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_110f);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_110e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_110d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_110c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_110b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_110a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1109);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1108);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1107);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1106);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1105);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1104);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1103);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1102);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1101);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1100);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10ff);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10fe);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10fd);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10fc);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10fb);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10fa);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10f9);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10f8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10f7);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10f6);
      ::std::allocator<char>::~allocator((allocator<char> *)local_10f5);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10e1);
      __cxa_atexit(::std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,&get_reserved_keyword_set[abi:cxx11]()::keywords_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&get_reserved_keyword_set[abi:cxx11]()::keywords_abi_cxx11_);
    }
  }
  return &get_reserved_keyword_set[abi:cxx11]()::keywords_abi_cxx11_;
}

Assistant:

const std::unordered_set<std::string> &CompilerMSL::get_reserved_keyword_set()
{
	static const unordered_set<string> keywords = {
		"kernel",
		"vertex",
		"fragment",
		"compute",
		"constant",
		"device",
		"bias",
		"level",
		"gradient2d",
		"gradientcube",
		"gradient3d",
		"min_lod_clamp",
		"assert",
		"VARIABLE_TRACEPOINT",
		"STATIC_DATA_TRACEPOINT",
		"STATIC_DATA_TRACEPOINT_V",
		"METAL_ALIGN",
		"METAL_ASM",
		"METAL_CONST",
		"METAL_DEPRECATED",
		"METAL_ENABLE_IF",
		"METAL_FUNC",
		"METAL_INTERNAL",
		"METAL_NON_NULL_RETURN",
		"METAL_NORETURN",
		"METAL_NOTHROW",
		"METAL_PURE",
		"METAL_UNAVAILABLE",
		"METAL_IMPLICIT",
		"METAL_EXPLICIT",
		"METAL_CONST_ARG",
		"METAL_ARG_UNIFORM",
		"METAL_ZERO_ARG",
		"METAL_VALID_LOD_ARG",
		"METAL_VALID_LEVEL_ARG",
		"METAL_VALID_STORE_ORDER",
		"METAL_VALID_LOAD_ORDER",
		"METAL_VALID_COMPARE_EXCHANGE_FAILURE_ORDER",
		"METAL_COMPATIBLE_COMPARE_EXCHANGE_ORDERS",
		"METAL_VALID_RENDER_TARGET",
		"is_function_constant_defined",
		"CHAR_BIT",
		"SCHAR_MAX",
		"SCHAR_MIN",
		"UCHAR_MAX",
		"CHAR_MAX",
		"CHAR_MIN",
		"USHRT_MAX",
		"SHRT_MAX",
		"SHRT_MIN",
		"UINT_MAX",
		"INT_MAX",
		"INT_MIN",
		"FLT_DIG",
		"FLT_MANT_DIG",
		"FLT_MAX_10_EXP",
		"FLT_MAX_EXP",
		"FLT_MIN_10_EXP",
		"FLT_MIN_EXP",
		"FLT_RADIX",
		"FLT_MAX",
		"FLT_MIN",
		"FLT_EPSILON",
		"FP_ILOGB0",
		"FP_ILOGBNAN",
		"MAXFLOAT",
		"HUGE_VALF",
		"INFINITY",
		"NAN",
		"M_E_F",
		"M_LOG2E_F",
		"M_LOG10E_F",
		"M_LN2_F",
		"M_LN10_F",
		"M_PI_F",
		"M_PI_2_F",
		"M_PI_4_F",
		"M_1_PI_F",
		"M_2_PI_F",
		"M_2_SQRTPI_F",
		"M_SQRT2_F",
		"M_SQRT1_2_F",
		"HALF_DIG",
		"HALF_MANT_DIG",
		"HALF_MAX_10_EXP",
		"HALF_MAX_EXP",
		"HALF_MIN_10_EXP",
		"HALF_MIN_EXP",
		"HALF_RADIX",
		"HALF_MAX",
		"HALF_MIN",
		"HALF_EPSILON",
		"MAXHALF",
		"HUGE_VALH",
		"M_E_H",
		"M_LOG2E_H",
		"M_LOG10E_H",
		"M_LN2_H",
		"M_LN10_H",
		"M_PI_H",
		"M_PI_2_H",
		"M_PI_4_H",
		"M_1_PI_H",
		"M_2_PI_H",
		"M_2_SQRTPI_H",
		"M_SQRT2_H",
		"M_SQRT1_2_H",
		"DBL_DIG",
		"DBL_MANT_DIG",
		"DBL_MAX_10_EXP",
		"DBL_MAX_EXP",
		"DBL_MIN_10_EXP",
		"DBL_MIN_EXP",
		"DBL_RADIX",
		"DBL_MAX",
		"DBL_MIN",
		"DBL_EPSILON",
		"HUGE_VAL",
		"M_E",
		"M_LOG2E",
		"M_LOG10E",
		"M_LN2",
		"M_LN10",
		"M_PI",
		"M_PI_2",
		"M_PI_4",
		"M_1_PI",
		"M_2_PI",
		"M_2_SQRTPI",
		"M_SQRT2",
		"M_SQRT1_2",
		"quad_broadcast",
		"thread",
		"threadgroup",
	};

	return keywords;
}